

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

ggml_tensor * __thiscall
llm_build_rwkv7_base::build_rwkv7_channel_mix
          (llm_build_rwkv7_base *this,llama_layer *layer,ggml_tensor *cur,ggml_tensor *x_prev,
          llm_arch arch)

{
  ggml_context *pgVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  
  uVar2 = ggml_sub((this->super_llm_graph_context).ctx0,x_prev);
  if (arch == LLM_ARCH_RWKV7) {
    pgVar1 = (this->super_llm_graph_context).ctx0;
    uVar2 = ggml_mul(pgVar1,uVar2,layer->channel_mix_lerp_k);
    pgVar3 = (ggml_tensor *)ggml_add(pgVar1,uVar2,cur);
    pgVar1 = (this->super_llm_graph_context).ctx0;
    pgVar3 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,layer->channel_mix_key,pgVar3);
    uVar2 = ggml_relu(pgVar1,pgVar3);
    pgVar3 = (ggml_tensor *)ggml_sqr(pgVar1,uVar2);
    pgVar3 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,layer->channel_mix_value,pgVar3);
    return pgVar3;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x2e10,"fatal error");
}

Assistant:

ggml_tensor * build_rwkv7_channel_mix(
            const llama_layer * layer,
            ggml_tensor * cur,
            ggml_tensor * x_prev,
            llm_arch arch) const {
        ggml_tensor * sx = ggml_sub(ctx0, x_prev, cur);
        switch (arch) {
            case LLM_ARCH_RWKV7:
                {
                    ggml_tensor * xk = ggml_add(ctx0, ggml_mul(ctx0, sx, layer->channel_mix_lerp_k), cur);

                    ggml_tensor * k = ggml_sqr(
                        ctx0,
                        ggml_relu(
                            ctx0,
                            build_lora_mm(layer->channel_mix_key, xk)
                        )
                    );

                    cur = build_lora_mm(layer->channel_mix_value, k);
                } break;
            default:
                GGML_ABORT("fatal error");
        }

        return cur;
    }